

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

BuildValue * __thiscall
anon_unknown.dwarf_6d004::PhonyCommand::getResultForOutput
          (BuildValue *__return_storage_ptr__,PhonyCommand *this,Node *node,BuildValue *value)

{
  if ((*(char *)&node[1]._vptr_Node == '\x03') && (*(char *)((long)&node[1]._vptr_Node + 1) == '\0')
     ) {
    __return_storage_ptr__->kind = VirtualInput;
    *(undefined8 *)&__return_storage_ptr__->numOutputInfos = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->signature).value + 4) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->valueData).asOutputInfo.device + 4) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->valueData).asOutputInfo.inode + 4) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->valueData).asOutputInfo.mode + 4) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->valueData).asOutputInfo.size + 4) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->valueData).asOutputInfo.modTime.seconds + 4) = 0
    ;
    *(undefined8 *)((long)&(__return_storage_ptr__->valueData).asOutputInfo.modTime.nanoseconds + 4)
         = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->valueData + 0x34) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->valueData + 0x3c) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->valueData + 0x44) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->valueData + 0x4c) = 0;
    (__return_storage_ptr__->stringValues).contents = (char *)0x0;
    (__return_storage_ptr__->stringValues).size = 0;
  }
  else {
    llbuild::buildsystem::ExternalCommand::getResultForOutput
              (__return_storage_ptr__,&this->super_ExternalCommand,node,value);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual BuildValue getResultForOutput(Node* node, const BuildValue& value) override {
    // If the node is virtual, the output is always a virtual input value,
    // regardless of the actual build value.
    //
    // This is a special case for phony commands, to avoid them incorrectly
    // propagating failed/cancelled states onwards to downstream commands when
    // they are being used only for ordering purposes.
    auto buildNode = static_cast<BuildNode*>(node);
    if (buildNode->isVirtual() && !buildNode->isCommandTimestamp()) {
      return BuildValue::makeVirtualInput();
    }

    // Otherwise, delegate to the inherited implementation.
    return ExternalCommand::getResultForOutput(node, value);
  }